

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall
testing::internal::FunctionMockerBase<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>
::ClearDefaultActionsLocked
          (FunctionMockerBase<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)> *this)

{
  pointer ppvVar1;
  pointer ppvVar2;
  pointer ppvVar3;
  void *pvVar4;
  pointer ppvVar5;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  ppvVar1 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppvVar2 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppvVar3 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
  super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
  super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
  super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  MutexBase::Unlock((MutexBase *)g_gmock_mutex);
  for (ppvVar5 = ppvVar1; ppvVar5 != ppvVar2; ppvVar5 = ppvVar5 + 1) {
    pvVar4 = *ppvVar5;
    if (pvVar4 != (void *)0x0) {
      linked_ptr<testing::ActionInterface<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>_>
      ::~linked_ptr((linked_ptr<testing::ActionInterface<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>_>
                     *)((long)pvVar4 + 0x58));
      *(undefined ***)((long)pvVar4 + 0x40) = &PTR__MatcherBase_002f8728;
      linked_ptr<const_testing::MatcherInterface<const_std::tuple<int,_BasicTestExpr<0>_>_&>_>::
      ~linked_ptr((linked_ptr<const_testing::MatcherInterface<const_std::tuple<int,_BasicTestExpr<0>_>_&>_>
                   *)((long)pvVar4 + 0x48));
      *(undefined ***)((long)pvVar4 + 0x28) = &PTR__MatcherBase_002f24e8;
      linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
                ((linked_ptr<const_testing::MatcherInterface<int>_> *)((long)pvVar4 + 0x30));
      *(undefined ***)((long)pvVar4 + 0x10) = &PTR__MatcherBase_002f2d50;
      linked_ptr<const_testing::MatcherInterface<BasicTestExpr<0>_>_>::~linked_ptr
                ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<0>_>_> *)
                 ((long)pvVar4 + 0x18));
      operator_delete(pvVar4,0x68);
    }
  }
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  if (ppvVar1 != (pointer)0x0) {
    operator_delete(ppvVar1,(long)ppvVar3 - (long)ppvVar1);
    return;
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    // Deleting our default actions may trigger other mock objects to be
    // deleted, for example if an action contains a reference counted smart
    // pointer to that mock object, and that is the last reference. So if we
    // delete our actions within the context of the global mutex we may deadlock
    // when this method is called again. Instead, make a copy of the set of
    // actions to delete, clear our set within the mutex, and then delete the
    // actions outside of the mutex.
    UntypedOnCallSpecs specs_to_delete;
    untyped_on_call_specs_.swap(specs_to_delete);

    g_gmock_mutex.Unlock();
    for (UntypedOnCallSpecs::const_iterator it =
             specs_to_delete.begin();
         it != specs_to_delete.end(); ++it) {
      delete static_cast<const OnCallSpec<F>*>(*it);
    }

    // Lock the mutex again, since the caller expects it to be locked when we
    // return.
    g_gmock_mutex.Lock();
  }